

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

size_t __thiscall ODDLParser::DataArrayList::size(DataArrayList *this)

{
  DataArrayList *local_28;
  DataArrayList *n;
  size_t result;
  DataArrayList *this_local;
  
  n = (DataArrayList *)0x0;
  if (this->m_next == (DataArrayList *)0x0) {
    n = (DataArrayList *)(ulong)(this->m_dataList != (Value *)0x0);
    this_local = n;
  }
  else {
    for (local_28 = this->m_next; local_28 != (DataArrayList *)0x0; local_28 = local_28->m_next) {
      n = (DataArrayList *)((long)&n->m_numItems + 1);
    }
    this_local = n;
  }
  return (size_t)this_local;
}

Assistant:

size_t DataArrayList::size() {
    size_t result( 0 );
    if ( ddl_nullptr == m_next ) {
        if ( m_dataList != ddl_nullptr ) {
            result = 1;
        }
        return result;
    }

    DataArrayList *n( m_next );
    while( ddl_nullptr != n ) {
        result++;
        n = n->m_next;
    }
    return result;
}